

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vpu_api_legacy.cpp
# Opt level: O0

RK_S32 __thiscall
VpuApiLegacy::encoder_getstream(VpuApiLegacy *this,VpuCodecContext *ctx,EncoderOut_t *aEncOut)

{
  RK_U8 *pRVar1;
  MppMeta local_70;
  uint local_60;
  RK_S32 local_5c;
  RK_U32 offset;
  RK_S32 is_intra;
  MppMeta meta;
  size_t length;
  RK_S64 pts;
  long lStack_38;
  RK_U32 eos;
  RK_U8 *src;
  MppPacket packet;
  EncoderOut_t *pEStack_20;
  RK_S32 ret;
  EncoderOut_t *aEncOut_local;
  VpuCodecContext *ctx_local;
  VpuApiLegacy *this_local;
  
  packet._4_4_ = 0;
  src = (RK_U8 *)0x0;
  pEStack_20 = aEncOut;
  aEncOut_local = (EncoderOut_t *)ctx;
  ctx_local = (VpuCodecContext *)this;
  if ((vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","enter\n","encoder_getstream");
  }
  packet._4_4_ = (*this->mpi->encode_get_packet)(this->mpp_ctx,&src);
  if (packet._4_4_ == MPP_OK) {
    if (src == (RK_U8 *)0x0) {
      pEStack_20->size = 0;
      if ((vpu_api_debug & 0x20) != 0) {
        _mpp_log_l(4,"vpu_api_legacy","get NULL packet, eos %d\n","encoder_getstream",this->mEosSet)
        ;
      }
      if (this->mEosSet != 0) {
        packet._4_4_ = MPP_NOK;
      }
    }
    else {
      lStack_38 = mpp_packet_get_data(src);
      pts._4_4_ = mpp_packet_get_eos(src);
      length = mpp_packet_get_pts(src);
      meta = (MppMeta)mpp_packet_get_length(src);
      _offset = mpp_packet_get_meta(src);
      local_5c = 0;
      local_60 = 0;
      if (*(int *)&aEncOut_local->field_0xc == 7) {
        local_60 = 4;
        if (meta < (MppMeta)0x5) {
          local_70 = (MppMeta)0x0;
        }
        else {
          local_70 = (MppMeta)((long)meta + -4);
        }
        meta = local_70;
      }
      pEStack_20->data = (RK_U8 *)0x0;
      if (meta != (MppMeta)0x0) {
        pRVar1 = (RK_U8 *)mpp_osal_calloc("encoder_getstream",
                                          (long)meta + 0x100fU & 0xfffffffffffff000);
        pEStack_20->data = pRVar1;
        if (pEStack_20->data != (RK_U8 *)0x0) {
          memcpy(pEStack_20->data,(void *)(lStack_38 + (ulong)local_60),(size_t)meta);
        }
      }
      mpp_meta_get_s32(_offset,0x6f696472,&local_5c);
      pEStack_20->size = (RK_S32)meta;
      pEStack_20->timeUs = length;
      pEStack_20->keyFrame = local_5c;
      if ((vpu_api_debug & 0x20) != 0) {
        _mpp_log_l(4,"vpu_api_legacy","get packet %p size %d pts %lld keyframe %d eos %d\n",
                   "encoder_getstream",src,meta,length,pEStack_20->keyFrame,pts._4_4_);
      }
      this->mEosSet = pts._4_4_;
      mpp_packet_deinit(&src);
    }
  }
  else {
    _mpp_log_l(2,"vpu_api_legacy","encode_get_packet failed ret %d\n","encoder_getstream",
               packet._4_4_);
  }
  if ((vpu_api_debug & 1) != 0) {
    _mpp_log_l(4,"vpu_api_legacy","leave ret %d\n","encoder_getstream",packet._4_4_);
  }
  return packet._4_4_;
}

Assistant:

RK_S32 VpuApiLegacy::encoder_getstream(VpuCodecContext *ctx, EncoderOut_t *aEncOut)
{
    RK_S32 ret = 0;
    MppPacket packet = NULL;
    vpu_api_dbg_func("enter\n");

    ret = mpi->encode_get_packet(mpp_ctx, &packet);
    if (ret) {
        mpp_err_f("encode_get_packet failed ret %d\n", ret);
        goto FUNC_RET;
    }
    if (packet) {
        RK_U8 *src = (RK_U8 *)mpp_packet_get_data(packet);
        RK_U32 eos = mpp_packet_get_eos(packet);
        RK_S64 pts = mpp_packet_get_pts(packet);
        size_t length = mpp_packet_get_length(packet);
        MppMeta meta = mpp_packet_get_meta(packet);
        RK_S32 is_intra = 0;

        RK_U32 offset = 0;
        if (ctx->videoCoding == OMX_RK_VIDEO_CodingAVC) {
            offset = 4;
            length = (length > offset) ? (length - offset) : 0;
        }
        aEncOut->data = NULL;
        if (length > 0) {
            aEncOut->data = mpp_calloc(RK_U8, MPP_ALIGN(length + 16, SZ_4K));
            if (aEncOut->data)
                memcpy(aEncOut->data, src + offset, length);
        }

        mpp_meta_get_s32(meta, KEY_OUTPUT_INTRA, &is_intra);

        aEncOut->size = (RK_S32)length;
        aEncOut->timeUs = pts;
        aEncOut->keyFrame = is_intra;

        vpu_api_dbg_output("get packet %p size %d pts %lld keyframe %d eos %d\n",
                           packet, length, pts, aEncOut->keyFrame, eos);

        mEosSet = eos;
        mpp_packet_deinit(&packet);
    } else {
        aEncOut->size = 0;
        vpu_api_dbg_output("get NULL packet, eos %d\n", mEosSet);
        if (mEosSet)
            ret = -1;
    }

FUNC_RET:
    vpu_api_dbg_func("leave ret %d\n", ret);
    return ret;
}